

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(void)

{
  char *pcVar1;
  string *in_RDI;
  char *cwd;
  char buf [2048];
  string *path;
  
  pcVar1 = Getcwd((char *)&cwd,0x800);
  std::__cxx11::string::string((string *)in_RDI);
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)in_RDI,pcVar1);
    ConvertToUnixSlashes(in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string SystemTools::GetCurrentWorkingDirectory()
{
  char buf[2048];
  const char* cwd = Getcwd(buf, 2048);
  std::string path;
  if (cwd) {
    path = cwd;
    SystemTools::ConvertToUnixSlashes(path);
  }
  return path;
}